

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStringEq(PrintExpressionContents *this,StringEq *curr)

{
  char *pcVar1;
  ostream *o;
  string_view str;
  size_t sVar2;
  
  if (curr->op == StringEqCompare) {
    o = this->o;
    pcVar1 = "string.compare";
    sVar2 = 0xe;
  }
  else {
    if (curr->op != StringEqEqual) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x9ea);
    }
    o = this->o;
    pcVar1 = "string.eq";
    sVar2 = 9;
  }
  str._M_str = pcVar1;
  str._M_len = sVar2;
  printMedium(o,str);
  return;
}

Assistant:

void visitStringEq(StringEq* curr) {
    switch (curr->op) {
      case StringEqEqual:
        printMedium(o, "string.eq");
        break;
      case StringEqCompare:
        printMedium(o, "string.compare");
        break;
      default:
        WASM_UNREACHABLE("invalid string.eq*");
    }
  }